

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.c
# Opt level: O1

void symbol_cleanup(lgx_ast_node_t *node)

{
  void *__ptr;
  lgx_ht_node_t *node_00;
  ulong uVar1;
  
  if (*(char *)node == '\x01') {
    for (node_00 = lgx_ht_first((node->u).symbols); node_00 != (lgx_ht_node_t *)0x0;
        node_00 = lgx_ht_next(node_00)) {
      __ptr = node_00->v;
      lgx_value_cleanup((lgx_value_t *)((long)__ptr + 0x28));
      lgx_type_cleanup((lgx_type_t *)((long)__ptr + 8));
      free(__ptr);
      node_00->v = (void *)0x0;
    }
  }
  if (node->children != 0) {
    uVar1 = 0;
    do {
      symbol_cleanup(node->child[uVar1]);
      uVar1 = uVar1 + 1;
    } while (uVar1 < node->children);
  }
  return;
}

Assistant:

static void symbol_cleanup(lgx_ast_node_t* node) {
    if (node->type == BLOCK_STATEMENT) {
        lgx_ht_node_t* n;
        for (n = lgx_ht_first(node->u.symbols); n; n = lgx_ht_next(n)) {
            symbol_del(n->v);
            n->v = NULL;
        }
    }

    int i;
    for (i = 0; i < node->children; ++i) {
        symbol_cleanup(node->child[i]);
    }
}